

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printf32mem(MCInst *MI,uint OpNo,SStream *O)

{
  cs_mode cVar1;
  uint uVar2;
  MCInst *in_RDI;
  uint in_stack_0000002c;
  MCInst *in_stack_00000030;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar2 = MCInst_getOpcode(in_RDI);
  if (uVar2 - 0x2f9 < 2) {
    SStream_concat0((SStream *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    in_RDI->x86opsize = '\n';
  }
  else if ((uVar2 == 0x309) || (uVar2 == 0x329)) {
    cVar1 = in_RDI->csh->mode;
    if (cVar1 == CS_MODE_16) {
      in_RDI->x86opsize = '\x0e';
    }
    else if ((cVar1 == CS_MODE_32) || (cVar1 == CS_MODE_64)) {
      in_RDI->x86opsize = '\x1c';
    }
  }
  else {
    SStream_concat0((SStream *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    in_RDI->x86opsize = '\x04';
  }
  printMemReference(in_stack_00000030,in_stack_0000002c,(SStream *)MI);
  return;
}

Assistant:

static void printf32mem(MCInst *MI, unsigned OpNo, SStream *O)
{
	switch(MCInst_getOpcode(MI)) {
		default:
			MI->x86opsize = 4;
			break;
		case X86_FBSTPm:
		case X86_FBLDm:
			// TODO: fix this in tablegen instead
			MI->x86opsize = 10;
			break;
		case X86_FSTENVm:
		case X86_FLDENVm:
			// TODO: fix this in tablegen instead
			switch(MI->csh->mode) {
				default:    // never reach
					break;
				case CS_MODE_16:
					MI->x86opsize = 14;
					break;
				case CS_MODE_32:
				case CS_MODE_64:
					MI->x86opsize = 28;
					break;
			}
			break;
	}

	printMemReference(MI, OpNo, O);
}